

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miditable.h
# Opt level: O3

TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> __thiscall
rtosc::MidiMapperStorage::
TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_>::insert
          (TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> *this,
          function<void_(short,_std::function<void_(const_char_*)>)> *t_)

{
  ulong uVar1;
  int iVar2;
  ulong *puVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  function<void_(short,_std::function<void_(const_char_*)>)> *__s;
  TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> TVar8;
  
  iVar2 = this->n;
  lVar7 = (long)iVar2;
  uVar1 = lVar7 + 1;
  uVar6 = 0xffffffffffffffff;
  if (-2 < lVar7) {
    uVar6 = uVar1 * 0x20 + 8;
  }
  puVar3 = (ulong *)operator_new__(uVar6);
  *puVar3 = uVar1;
  __s = (function<void_(short,_std::function<void_(const_char_*)>)> *)(puVar3 + 1);
  if ((int)uVar1 != 0) {
    memset(__s,0,uVar1 * 0x20);
    if (0 < iVar2) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        std::function<void_(short,_std::function<void_(const_char_*)>)>::operator=
                  ((function<void_(short,_std::function<void_(const_char_*)>)> *)
                   ((long)&(__s->super__Function_base)._M_functor + lVar5),
                   (function<void_(short,_std::function<void_(const_char_*)>)> *)
                   ((long)&(this->t->super__Function_base)._M_functor + lVar5));
        lVar4 = lVar4 + 1;
        lVar7 = (long)this->n;
        lVar5 = lVar5 + 0x20;
      } while (lVar4 < lVar7);
    }
  }
  std::function<void_(short,_std::function<void_(const_char_*)>)>::operator=(__s + lVar7,t_);
  TVar8._0_8_ = uVar1 & 0xffffffff;
  TVar8.t = __s;
  return TVar8;
}

Assistant:

TinyVector insert(const T &t_)
            {TinyVector next(n+1); for(int i=0;i<n; ++i) next.t[i]=t[i]; next.t[n] = t_;return next;}